

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O0

void __thiscall L15_4::LabeledSales::~LabeledSales(LabeledSales *this)

{
  LabeledSales *this_local;
  
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_0015fac0;
  std::__cxx11::string::~string((string *)&this->_label);
  Sales::~Sales(&this->super_Sales);
  return;
}

Assistant:

virtual ~LabeledSales() {}